

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_data_layout.h
# Opt level: O2

void __thiscall
dlib::row_major_layout::
layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::set_size
          (layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5> *this,
          size_t nr,size_t nc)

{
  rgb_pixel *prVar1;
  
  if (this->data != (rgb_pixel *)0x0) {
    operator_delete__(this->data);
  }
  prVar1 = memory_manager_stateless_kernel_1<dlib::rgb_pixel>::allocate_array(&this->pool,nc * nr);
  this->data = prVar1;
  this->nr_ = nr;
  this->nc_ = nc;
  return;
}

Assistant:

void set_size (
                size_t nr,
                size_t nc
            )
            {
                if (data) 
                {
                    pool.deallocate_array(data);
                }
                data = pool.allocate_array(nr*nc);
                nr_ = nr;
                nc_ = nc;
            }